

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O0

string * process_with_aes(string *__return_storage_ptr__,string *key,bool encrypt,string *data,
                         size_t outlength,uint repetitions,uchar *iv,size_t iv_length)

{
  uint uVar1;
  uchar *key_00;
  string local_158;
  undefined4 local_138;
  uint local_134;
  unsigned_long uStack_130;
  uint i;
  undefined1 local_118 [8];
  Pl_AES_PDF aes;
  Pl_Buffer buffer;
  uint repetitions_local;
  size_t outlength_local;
  string *data_local;
  bool encrypt_local;
  string *key_local;
  
  Pl_Buffer::Pl_Buffer((Pl_Buffer *)&aes.use_zero_iv,"buffer",(Pipeline *)0x0);
  key_00 = QUtil::unsigned_char_pointer(key);
  uStack_130 = std::__cxx11::string::length();
  uVar1 = QIntC::to_uint<unsigned_long>(&stack0xfffffffffffffed0);
  Pl_AES_PDF::Pl_AES_PDF
            ((Pl_AES_PDF *)local_118,"aes",(Pipeline *)&aes.use_zero_iv,encrypt,key_00,(ulong)uVar1)
  ;
  if (iv == (uchar *)0x0) {
    Pl_AES_PDF::useZeroIV((Pl_AES_PDF *)local_118);
  }
  else {
    Pl_AES_PDF::setIV((Pl_AES_PDF *)local_118,iv,iv_length);
  }
  Pl_AES_PDF::disablePadding((Pl_AES_PDF *)local_118);
  for (local_134 = 0; local_134 < repetitions; local_134 = local_134 + 1) {
    Pipeline::writeString((Pipeline *)local_118,data);
  }
  Pl_AES_PDF::finish((Pl_AES_PDF *)local_118);
  if (outlength == 0) {
    Pl_Buffer::getString_abi_cxx11_(__return_storage_ptr__,(Pl_Buffer *)&aes.use_zero_iv);
  }
  else {
    Pl_Buffer::getString_abi_cxx11_(&local_158,(Pl_Buffer *)&aes.use_zero_iv);
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&local_158);
    std::__cxx11::string::~string((string *)&local_158);
  }
  local_138 = 1;
  Pl_AES_PDF::~Pl_AES_PDF((Pl_AES_PDF *)local_118);
  Pl_Buffer::~Pl_Buffer((Pl_Buffer *)&aes.use_zero_iv);
  return __return_storage_ptr__;
}

Assistant:

static std::string
process_with_aes(
    std::string const& key,
    bool encrypt,
    std::string const& data,
    size_t outlength = 0,
    unsigned int repetitions = 1,
    unsigned char const* iv = nullptr,
    size_t iv_length = 0)
{
    Pl_Buffer buffer("buffer");
    Pl_AES_PDF aes(
        "aes", &buffer, encrypt, QUtil::unsigned_char_pointer(key), QIntC::to_uint(key.length()));
    if (iv) {
        aes.setIV(iv, iv_length);
    } else {
        aes.useZeroIV();
    }
    aes.disablePadding();
    for (unsigned int i = 0; i < repetitions; ++i) {
        aes.writeString(data);
    }
    aes.finish();
    if (outlength == 0) {
        return buffer.getString();
    } else {
        return buffer.getString().substr(0, outlength);
    }
}